

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_resample_filters.cpp
# Opt level: O0

float basisu::bell_filter(float t)

{
  float t_local;
  undefined4 local_4;
  
  t_local = t;
  if (t < 0.0) {
    t_local = -t;
  }
  if (0.5 <= t_local) {
    if (1.5 <= t_local) {
      local_4 = 0.0;
    }
    else {
      local_4 = (t_local - 1.5) * (t_local - 1.5) * 0.5;
    }
  }
  else {
    local_4 = 0.75 - t_local * t_local;
  }
  return local_4;
}

Assistant:

static float bell_filter(float t) /* box (*) box (*) box */
	{
		if (t < 0.0f)
			t = -t;

		if (t < .5f)
			return (.75f - (t * t));

		if (t < 1.5f)
		{
			t = (t - 1.5f);
			return (.5f * (t * t));
		}

		return (0.0f);
	}